

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnLocusP.cpp
# Opt level: O0

LLPoint GeoCalcs::PointOnLocusP(Locus *loc,LLPoint *geoPt,double tol,double eps)

{
  undefined1 local_58 [8];
  InverseResult result;
  double distp;
  double eps_local;
  double tol_local;
  LLPoint *geoPt_local;
  Locus *loc_local;
  
  result.distance = DistToLocusP(loc,geoPt,tol,eps);
  if ((result.distance != 0.0) || (NAN(result.distance))) {
    INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)local_58);
    DistVincenty(geoPt,&loc->geoStart,(InverseResult *)local_58);
    local_58 = (undefined1  [8])
               ((double)(~-(ulong)(0.0 < result.distance) & 0x3ff921fb54442d18 |
                        -(ulong)(0.0 < result.distance) & 0xbff921fb54442d18) + (double)local_58);
    _loc_local = DestVincenty(geoPt,(double)local_58,ABS(result.distance));
  }
  else {
    _loc_local = *geoPt;
  }
  return _loc_local;
}

Assistant:

LLPoint PointOnLocusP(const Locus &loc, const LLPoint &geoPt, double tol, double eps)
    {
        const double distp = DistToLocusP(loc, geoPt, tol, eps);

        if (distp == 0)
            return geoPt;

        InverseResult result;
        DistVincenty(geoPt, loc.geoStart, result);

        result.azimuth += distp > 0.0 ? -M_PI / 2.0 : M_PI / 2.0;

        return DestVincenty(geoPt, result.azimuth, fabs(distp));
    }